

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int macro_dis_dst(char *out,uint32_t c)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint c_00;
  
  pcVar3 = mcr_maddrsend;
  pcVar2 = mcr_parmsend;
  pcVar1 = mcr_send;
  pcVar8 = mcr_maddr;
  pcVar7 = mcr_mov;
  pcVar5 = mcr_parm;
  c_00 = (uint)out;
  uVar4 = c_00 & 0x70;
  if (uVar4 == 0x10) {
    sprintf(reg1_str::r,"%s$r%d%s",colors->reg,(ulong)(c_00 >> 8 & 7),colors->reset);
    pcVar8 = "%s %s";
  }
  else {
    if (((ulong)out & 0x70) != 0) {
      uVar6 = c_00 & 0x770;
      pcVar7 = mcr_maddr;
      if (uVar6 == 0x20) {
LAB_0024e9b4:
        strcpy(outs,pcVar7);
        return 1;
      }
      if (uVar4 == 0x30) {
        sprintf(reg1_str::r,"%s$r%d%s",colors->reg,(ulong)(c_00 >> 8 & 7),colors->reset);
        sprintf(outs,"%s %s %s",pcVar5,reg1_str::r,mcr_send);
        return 0;
      }
      if (uVar4 == 0x20) {
        sprintf(reg1_str::r,"%s$r%d%s",colors->reg,(ulong)(c_00 >> 8 & 7),colors->reset);
        pcVar5 = reg1_str::r;
        pcVar7 = pcVar8;
      }
      else {
        if (uVar6 == 0x40) {
          strcpy(outs,mcr_send);
          return 0;
        }
        if (uVar4 == 0x50) {
          reg1_str(c_00);
          pcVar8 = reg1_str::r;
          pcVar7 = mcr_maddr;
LAB_0024eb0a:
          sprintf(outs,"%s %s %s",pcVar5,pcVar8,pcVar7);
          return 1;
        }
        if (uVar4 == 0x40) {
          reg1_str(c_00);
          pcVar8 = "%s %s";
          pcVar7 = pcVar1;
          goto LAB_0024e994;
        }
        pcVar5 = mcr_maddr;
        pcVar7 = mcr_parmsend;
        if (uVar6 != 0x60) {
          if (uVar4 == 0x60) {
            reg1_str(c_00);
            pcVar5 = pcVar2;
            pcVar7 = reg1_str::r;
            goto LAB_0024eb0a;
          }
          pcVar7 = mcr_maddrsend;
          if (uVar6 == 0x70) goto LAB_0024e9b4;
          if (uVar4 != 0x70) {
            builtin_strncpy(outs,"???",4);
            return 0;
          }
          reg1_str(c_00);
          pcVar5 = reg1_str::r;
          pcVar7 = pcVar3;
        }
      }
      sprintf(outs,"%s %s",pcVar7,pcVar5);
      return 1;
    }
    sprintf(reg1_str::r,"%s$r%d%s",colors->reg,(ulong)((uint)((ulong)out >> 8) & 7),colors->reset);
    pcVar8 = "%s %s ign";
    pcVar7 = pcVar5;
  }
LAB_0024e994:
  sprintf(outs,pcVar8,pcVar7,reg1_str::r);
  return 0;
}

Assistant:

static int macro_dis_dst(char *out, uint32_t c)
{
	int expects_maddr = 0;
	if ((c & 0x00000070) == 0x00000000)
	{
		// { 0x00000000, 0x00000070, N("parm"), REG1, N("ign") }
		sprintf(out, "%s %s ign", mcr_parm, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000010)
	{
		// { 0x00000010, 0x00000070, N("mov"), REG1 }
		sprintf(out, "%s %s", mcr_mov, reg1_str(c));
	}
	else if ((c & 0x00000770) == 0x00000020)
	{
		// { 0x00000020, 0x00000770, N("maddr") }
		sprintf(out, "%s", mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000020)
	{
		// { 0x00000020, 0x00000070, N("maddr"), REG1 }
		sprintf(out, "%s %s", mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000030)
	{
		// { 0x00000030, 0x00000070, N("parm"), REG1, N("send") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_send);
	}
	else if ((c & 0x00000770) == 0x00000040)
	{
		// { 0x00000040, 0x00000770, N("send") }
		sprintf(out, "%s", mcr_send);
	}
	else if ((c & 0x00000070) == 0x00000040)
	{
		// { 0x00000040, 0x00000070, N("send"), REG1 }
		sprintf(out, "%s %s", mcr_send, reg1_str(c));
	}
	else if ((c & 0x00000070) == 0x00000050)
	{
		// { 0x00000050, 0x00000070, N("parm"), REG1, N("maddr") }
		sprintf(out, "%s %s %s", mcr_parm, reg1_str(c), mcr_maddr);
		return 1;
	}
	else if ((c & 0x00000770) == 0x00000060)
	{
		// { 0x00000060, 0x00000770, N("parmsend"), N("maddr") }
		sprintf(out, "%s %s", mcr_parmsend, mcr_maddr);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000060)
	{
		// { 0x00000060, 0x00000070, N("parmsend"), N("maddr"), REG1 }
		sprintf(out, "%s %s %s", mcr_parmsend, mcr_maddr, reg1_str(c));
		expects_maddr = 1;
	}
	else if ((c & 0x00000770) == 0x00000070)
	{
		// { 0x00000070, 0x00000770, N("maddrsend") }
		sprintf(out, "%s", mcr_maddrsend);
		expects_maddr = 1;
	}
	else if ((c & 0x00000070) == 0x00000070)
	{
		// { 0x00000070, 0x00000070, N("maddrsend"), REG1 }
		sprintf(out, "%s %s", mcr_maddrsend, reg1_str(c));
		expects_maddr = 1;
	}
	else
		sprintf(out, "???");

	return expects_maddr;
}